

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_token_write_quoted(fy_emitter *emit,fy_token *fyt,int flags,int indent,char qc)

{
  fy_emit_accum *ea;
  size_t *psVar1;
  int *piVar2;
  byte bVar3;
  fy_emitter_cfg_flags fVar4;
  fy_emitter *pfVar5;
  size_t sVar6;
  fy_atom_style fVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  char *str;
  fy_atom *atom;
  undefined8 extraout_RAX;
  undefined8 uVar11;
  fy_emitter_write_type fVar12;
  fy_emitter_cfg_flags fVar13;
  ulong uVar14;
  int c;
  fy_emitter_write_type wtype;
  int iVar15;
  bool bVar16;
  uint8_t non_utf8 [4];
  size_t len;
  fy_atom_iter iter;
  size_t local_238;
  undefined4 local_230;
  byte local_22c [4];
  ulong local_228;
  size_t local_220;
  fy_atom_iter local_218;
  undefined4 extraout_var;
  
  local_220 = 0;
  bVar16 = (flags & 0x40U) == 0;
  fVar12 = fyewt_single_quoted_scalar_key;
  if (bVar16) {
    fVar12 = fyewt_single_quoted_scalar;
  }
  wtype = fyewt_double_quoted_scalar_key;
  if (bVar16) {
    wtype = fyewt_double_quoted_scalar;
  }
  bVar16 = qc != '\'';
  if (!bVar16) {
    wtype = fVar12;
  }
  fy_emit_write_indicator(emit,bVar16 + 10 + (uint)bVar16,flags,indent,wtype);
  if (fyt != (fy_token *)0x0) {
    str = fy_token_get_direct_output(fyt,&local_220);
    if ((str == (char *)0x0) ||
       (fVar7 = fy_token_atom_style(fyt), fVar7 != (qc == '\"') + FYAS_SINGLE_QUOTED)) {
      atom = fy_token_atom(fyt);
      if (atom != (fy_atom *)0x0) {
        if ((flags & 8U) == 0) {
          fVar4 = emit->cfg->flags;
          fVar13 = fVar4 & 0xf00000;
          local_230 = CONCAT31((int3)(fVar13 >> 8),
                               fVar13 != FYECF_MODE_FLOW_ONELINE &&
                               (fVar13 != FYECF_MODE_JSON_ONELINE &&
                               (fVar4 & 0xe00000) != FYECF_MODE_JSON));
        }
        else {
          local_230 = 0;
        }
        fy_atom_iter_start(atom,&local_218);
        pfVar5 = (emit->ea).emit;
        if (pfVar5 == (fy_emitter *)0x0) {
          __assert_fail("ea->emit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.h"
                        ,0x85,
                        "void fy_emit_accum_start(struct fy_emit_accum *, enum fy_emitter_write_type)"
                       );
        }
        iVar9 = pfVar5->column;
        (emit->ea).start_col = iVar9;
        (emit->ea).type = wtype;
        (emit->ea).next = 0;
        (emit->ea).utf8_count = 0;
        (emit->ea).col = iVar9;
        local_238 = 4;
        uVar8 = fy_atom_iter_utf8_quoted_get(&local_218,&local_238,local_22c);
        if (-1 < (int)uVar8) {
          ea = &emit->ea;
          local_228 = 0;
          bVar16 = false;
          do {
            if ((uVar8 == 0) && (local_238 != 0)) {
              if (local_238 != 0) {
                uVar14 = 0;
                do {
                  bVar3 = local_22c[uVar14];
                  do {
                    sVar6 = (emit->ea).next;
                    if ((emit->ea).alloc != sVar6) {
                      (emit->ea).accum[sVar6] = '\\';
                      psVar1 = &(emit->ea).next;
                      *psVar1 = *psVar1 + 1;
                      piVar2 = &(emit->ea).utf8_count;
                      *piVar2 = *piVar2 + 1;
                      piVar2 = &(emit->ea).col;
                      *piVar2 = *piVar2 + 1;
                      break;
                    }
                    iVar9 = fy_emit_accum_grow(ea);
                  } while (iVar9 == 0);
                  do {
                    sVar6 = (emit->ea).next;
                    if ((emit->ea).alloc != sVar6) {
                      (emit->ea).accum[sVar6] = 'x';
                      psVar1 = &(emit->ea).next;
                      *psVar1 = *psVar1 + 1;
                      piVar2 = &(emit->ea).utf8_count;
                      *piVar2 = *piVar2 + 1;
                      piVar2 = &(emit->ea).col;
                      *piVar2 = *piVar2 + 1;
                      break;
                    }
                    iVar9 = fy_emit_accum_grow(ea);
                  } while (iVar9 == 0);
                  iVar9 = (bVar3 >> 4) + 0x37;
                  if (bVar3 < 0xa0) {
                    iVar9 = (bVar3 >> 4) + 0x30;
                  }
                  fy_emit_accum_utf8_put(ea,iVar9);
                  uVar8 = bVar3 & 0xf;
                  iVar9 = uVar8 + 0x37;
                  if (uVar8 < 10) {
                    iVar9 = uVar8 + 0x30;
                  }
                  fy_emit_accum_utf8_put(ea,iVar9);
                  uVar14 = uVar14 + 1;
                } while (uVar14 < local_238);
              }
            }
            else if (uVar8 == 0x20) {
LAB_00127616:
              if (((char)local_230 == '\0') || ((local_228 & 1) != 0)) {
LAB_00127903:
                iVar9 = fy_emit_accum_utf8_put(ea,uVar8);
                uVar11 = CONCAT44(extraout_var,iVar9);
              }
              else {
                uVar10 = emit->cfg->flags >> 0xc;
                if ((char)uVar10 == '\0') {
                  uVar10 = 0x50;
                }
                else if ((uVar10 & 0xff) == 0xff) {
                  uVar10 = 0x7fffffff;
                }
                else {
                  uVar10 = uVar10 & 0xff;
                }
                if ((emit->ea).col <= (int)uVar10) goto LAB_00127903;
                if (qc == '\'') {
                  iVar9 = fy_atom_iter_utf8_peek(&local_218);
                  if ((iVar9 != 9) && (iVar9 != 0x20)) goto LAB_00127903;
                  sVar6 = (emit->ea).next;
                  if (sVar6 != 0) {
                    fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar6);
                  }
                  (emit->ea).next = 0;
                  (emit->ea).utf8_count = 0;
                  (emit->ea).col = (emit->ea).start_col;
                }
                else {
                  if (qc != '\"') goto LAB_00127903;
                  sVar6 = (emit->ea).next;
                  if (sVar6 != 0) {
                    fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar6);
                  }
                  (emit->ea).next = 0;
                  (emit->ea).utf8_count = 0;
                  (emit->ea).col = (emit->ea).start_col;
                  iVar9 = fy_atom_iter_utf8_peek(&local_218);
                  if ((iVar9 == 0x20) || (iVar9 == 9)) {
                    fy_emit_putc(emit,wtype,0x5c);
                  }
                }
                *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                fy_emit_write_indent(emit,indent);
                uVar11 = extraout_RAX;
              }
              local_228 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
              bVar16 = false;
            }
            else {
              if (qc == '\'') {
                if ((int)uVar8 < 0x85) {
                  if (uVar8 == 9) goto LAB_00127616;
                  if ((uVar8 == 10) || (uVar8 == 0xd)) goto LAB_00127690;
                }
                else if ((uVar8 - 0x2028 < 2) || (uVar8 == 0x85)) {
LAB_00127690:
                  if ((char)local_230 != '\0') {
                    if (!bVar16) {
                      sVar6 = (emit->ea).next;
                      if (sVar6 != 0) {
                        fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar6);
                      }
                      (emit->ea).next = 0;
                      (emit->ea).utf8_count = 0;
                      (emit->ea).col = (emit->ea).start_col;
                      fy_emit_write_indent(emit,indent);
                    }
                    *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                    fy_emit_write_indent(emit,indent);
                    bVar16 = true;
                    goto LAB_001275e5;
                  }
                  break;
                }
              }
              if (bVar16) {
                sVar6 = (emit->ea).next;
                if (sVar6 != 0) {
                  fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar6);
                }
                (emit->ea).next = 0;
                (emit->ea).utf8_count = 0;
                (emit->ea).col = (emit->ea).start_col;
                fy_emit_write_indent(emit,indent);
              }
              if ((qc == '\'') && (uVar8 == 0x27)) {
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = '\'';
                    psVar1 = &(emit->ea).next;
                    *psVar1 = *psVar1 + 1;
                    piVar2 = &(emit->ea).utf8_count;
                    *piVar2 = *piVar2 + 1;
                    piVar2 = &(emit->ea).col;
                    *piVar2 = *piVar2 + 1;
                    break;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
LAB_001277d2:
                sVar6 = (emit->ea).next;
                if ((emit->ea).alloc == sVar6) goto code_r0x001277dc;
                (emit->ea).accum[sVar6] = '\'';
LAB_001277f5:
                psVar1 = &(emit->ea).next;
                *psVar1 = *psVar1 + 1;
                piVar2 = &(emit->ea).utf8_count;
                *piVar2 = *piVar2 + 1;
                piVar2 = &(emit->ea).col;
                *piVar2 = *piVar2 + 1;
                goto LAB_00127cd5;
              }
              if (qc != '\"') goto LAB_00127cd0;
              if ((int)uVar8 < 0xa0) {
                if (((0xd < uVar8) || ((0x2600U >> (uVar8 & 0x1f) & 1) == 0)) && (uVar8 != 0x85)) {
LAB_00127934:
                  if (((((uVar8 - 0xa0 < 0xd760 || uVar8 - 0x20 < 0x5f) ||
                        (uVar8 != 0xfeff && 0xffffe001 < uVar8 - 0xfffe)) && (uVar8 != 0x22)) &&
                      (uVar8 != 0x5c)) &&
                     ((fVar4 = emit->cfg->flags,
                      (fVar4 & 0xe00000) != FYECF_MODE_JSON &&
                      (fVar4 & 0xf00000) != FYECF_MODE_JSON_ONELINE ||
                      (((uVar8 - 0x20 < 0x10ffe1 && (uVar8 != 0x5c)) && (uVar8 != 0x22))))))
                  goto LAB_00127cd0;
                }
              }
              else if ((1 < uVar8 - 0x2028) && (uVar8 != 0xa0)) goto LAB_00127934;
              do {
                sVar6 = (emit->ea).next;
                if ((emit->ea).alloc != sVar6) {
                  (emit->ea).accum[sVar6] = '\\';
                  psVar1 = &(emit->ea).next;
                  *psVar1 = *psVar1 + 1;
                  piVar2 = &(emit->ea).utf8_count;
                  *piVar2 = *piVar2 + 1;
                  piVar2 = &(emit->ea).col;
                  *piVar2 = *piVar2 + 1;
                  break;
                }
                iVar9 = fy_emit_accum_grow(ea);
              } while (iVar9 == 0);
              switch(uVar8) {
              case 8:
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = 'b';
                    goto LAB_001277f5;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
                break;
              case 9:
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = 't';
                    goto LAB_001277f5;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
                break;
              case 10:
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = 'n';
                    goto LAB_001277f5;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
                break;
              case 0xb:
switchD_001279c6_caseD_b:
                fVar4 = emit->cfg->flags;
                if ((fVar4 & 0xf00000) == FYECF_MODE_JSON_ONELINE ||
                    (fVar4 & 0xe00000) == FYECF_MODE_JSON) {
                  if (uVar8 < 0x10000) {
                    fy_emit_accum_utf8_put(ea,0x75);
                    iVar9 = 0xc;
                    do {
                      uVar10 = uVar8 >> ((byte)iVar9 & 0x1f) & 0xf;
                      iVar15 = uVar10 + 0x37;
                      if (uVar10 < 10) {
                        iVar15 = uVar10 + 0x30;
                      }
                      fy_emit_accum_utf8_put(ea,iVar15);
                      iVar9 = iVar9 + -4;
                    } while (iVar9 != -4);
                  }
                  else {
                    fy_emit_accum_utf8_put(ea,0x75);
                    iVar9 = 0xc;
                    do {
                      uVar10 = ((uVar8 >> 10 & 0x7ff) - 0x40 | 0xd800) >> ((byte)iVar9 & 0x1f) & 0xf
                      ;
                      iVar15 = uVar10 + 0x37;
                      if (uVar10 < 10) {
                        iVar15 = uVar10 + 0x30;
                      }
                      fy_emit_accum_utf8_put(ea,iVar15);
                      iVar9 = iVar9 + -4;
                    } while (iVar9 != -4);
                    fy_emit_accum_utf8_put(ea,0x5c);
                    fy_emit_accum_utf8_put(ea,0x75);
                    iVar9 = 0xc;
                    do {
                      uVar10 = (uVar8 & 0x3ff | 0xdc00) >> ((byte)iVar9 & 0x1f) & 0xf;
                      iVar15 = uVar10 + 0x37;
                      if (uVar10 < 10) {
                        iVar15 = uVar10 + 0x30;
                      }
                      fy_emit_accum_utf8_put(ea,iVar15);
                      iVar9 = iVar9 + -4;
                    } while (iVar9 != -4);
                  }
                }
                else {
                  if ((int)uVar8 < 0x85) {
                    if ((int)uVar8 < 0xb) {
                      if (uVar8 == 0) {
                        uVar8 = 0x30;
                      }
                      else {
                        if (uVar8 != 7) {
LAB_00127d46:
                          uVar10 = (uint)(uVar8 < 0x10000) << 5 | 0x55;
                          if (uVar8 < 0x100) {
                            uVar10 = 0x78;
                          }
                          iVar9 = (uint)(uVar8 >= 0x10000) * 4 + 4;
                          if (uVar8 < 0x100) {
                            iVar9 = 2;
                          }
                          fy_emit_accum_utf8_put(ea,uVar10);
                          iVar15 = iVar9 + 1;
                          iVar9 = iVar9 * 4;
                          do {
                            iVar9 = iVar9 + -4;
                            uVar10 = uVar8 >> ((byte)iVar9 & 0x1f) & 0xf;
                            c = uVar10 + 0x37;
                            if (uVar10 < 10) {
                              c = uVar10 + 0x30;
                            }
                            fy_emit_accum_utf8_put(ea,c);
                            iVar15 = iVar15 + -1;
                          } while (1 < iVar15);
                          break;
                        }
                        uVar8 = 0x61;
                      }
                    }
                    else if (uVar8 == 0xb) {
                      uVar8 = 0x76;
                    }
                    else {
                      if (uVar8 != 0x1b) goto LAB_00127d46;
                      uVar8 = 0x65;
                    }
                  }
                  else if ((int)uVar8 < 0x2028) {
                    if (uVar8 == 0x85) {
                      uVar8 = 0x4e;
                    }
                    else {
                      if (uVar8 != 0xa0) goto LAB_00127d46;
                      uVar8 = 0x5f;
                    }
                  }
                  else if (uVar8 == 0x2028) {
                    uVar8 = 0x4c;
                  }
                  else {
                    if (uVar8 != 0x2029) goto LAB_00127d46;
                    uVar8 = 0x50;
                  }
LAB_00127cd0:
                  fy_emit_accum_utf8_put(ea,uVar8);
                }
                break;
              case 0xc:
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = 'f';
                    goto LAB_001277f5;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
                break;
              case 0xd:
                do {
                  sVar6 = (emit->ea).next;
                  if ((emit->ea).alloc != sVar6) {
                    (emit->ea).accum[sVar6] = 'r';
                    goto LAB_001277f5;
                  }
                  iVar9 = fy_emit_accum_grow(ea);
                } while (iVar9 == 0);
                break;
              default:
                if (uVar8 == 0x22) {
                  do {
                    sVar6 = (emit->ea).next;
                    if ((emit->ea).alloc != sVar6) {
                      (emit->ea).accum[sVar6] = '\"';
                      goto LAB_001277f5;
                    }
                    iVar9 = fy_emit_accum_grow(ea);
                  } while (iVar9 == 0);
                }
                else {
                  if (uVar8 != 0x5c) goto switchD_001279c6_caseD_b;
                  do {
                    sVar6 = (emit->ea).next;
                    if ((emit->ea).alloc != sVar6) {
                      (emit->ea).accum[sVar6] = '\\';
                      goto LAB_001277f5;
                    }
                    iVar9 = fy_emit_accum_grow(ea);
                  } while (iVar9 == 0);
                }
              }
LAB_00127cd5:
              *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
              bVar16 = false;
              local_228 = 0;
            }
LAB_001275e5:
            local_238 = 4;
            uVar8 = fy_atom_iter_utf8_quoted_get(&local_218,&local_238,local_22c);
          } while (-1 < (int)uVar8);
        }
        sVar6 = (emit->ea).next;
        if (sVar6 != 0) {
          fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar6);
        }
        (emit->ea).next = 0;
        (emit->ea).utf8_count = 0;
        (emit->ea).col = (emit->ea).start_col;
        fy_atom_iter_finish(&local_218);
      }
    }
    else {
      fy_emit_write(emit,wtype,str,(int)local_220);
    }
  }
  fy_emit_write_indicator(emit,(qc != '\'') + 0xb + (uint)(qc != '\''),flags,indent,wtype);
  return;
code_r0x001277dc:
  iVar9 = fy_emit_accum_grow(ea);
  if (iVar9 != 0) goto LAB_00127cd5;
  goto LAB_001277d2;
}

Assistant:

void fy_emit_token_write_quoted(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char qc) {
    bool allow_breaks, spaces, breaks;
    int c, i, w, digit;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    bool should_indent, done_esc;
    struct fy_atom *atom;
    struct fy_atom_iter iter;
    enum fy_atom_style target_style;
    uint32_t hi_surrogate, lo_surrogate;
    uint8_t non_utf8[4];
    size_t non_utf8_len, k;

    wtype = qc == '\'' ?
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_single_quoted_scalar_key : fyewt_single_quoted_scalar) :
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_double_quoted_scalar_key : fyewt_double_quoted_scalar);

    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_start : di_double_quote_start,
                            flags, indent, wtype);

    /* XXX check whether this is ever the case */
    if (!fyt)
        goto out;

    /* note that if the original target style and the target differ
     * we can note use direct output
     */
    target_style = qc == '"' ? FYAS_DOUBLE_QUOTED : FYAS_SINGLE_QUOTED;

    /* simple case of direct output (large amount of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == target_style) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    /* no atom? i.e. empty */
    atom = fy_token_atom(fyt);
    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    for (;;) {
        non_utf8_len = sizeof(non_utf8);
        c = fy_atom_iter_utf8_quoted_get(&iter, &non_utf8_len, non_utf8);
        if (c < 0)
            break;

        if (c == 0 && non_utf8_len > 0) {
            for (k = 0; k < non_utf8_len; k++) {
                c = (int) non_utf8[k] & 0xff;
                fy_emit_accum_utf8_put(&emit->ea, '\\');
                fy_emit_accum_utf8_put(&emit->ea, 'x');
                digit = ((unsigned int) c >> 4) & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                digit = (unsigned int) c & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
            }
            continue;
        }

        if (fy_is_space(c) || (qc == '\'' && fy_is_ws(c))) {
            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent &&
                ((qc == '\'' && fy_is_ws(fy_atom_iter_utf8_peek(&iter))) ||
                 qc == '"')) {
                fy_emit_accum_output(&emit->ea);

                if (qc == '"' && fy_is_ws(fy_atom_iter_utf8_peek(&iter)))
                    fy_emit_putc(emit, wtype, '\\');

                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;
            breaks = false;

        } else if (qc == '\'' && fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;
        } else {
            /* output run */
            if (breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            /* escape */
            if (qc == '\'' && c == '\'') {
                fy_emit_accum_utf8_put(&emit->ea, '\'');
                fy_emit_accum_utf8_put(&emit->ea, '\'');
            } else if (qc == '"' &&
                       ((!fy_is_printq(c) || c == '"' || c == '\\') ||
                        (fy_emit_is_json_mode(emit) && !fy_is_json_unescaped(c)))) {

                fy_emit_accum_utf8_put(&emit->ea, '\\');

                /* common YAML and JSON escapes */
                done_esc = false;
                switch (c) {
                    case '\b':
                        fy_emit_accum_utf8_put(&emit->ea, 'b');
                        done_esc = true;
                        break;
                    case '\f':
                        fy_emit_accum_utf8_put(&emit->ea, 'f');
                        done_esc = true;
                        break;
                    case '\n':
                        fy_emit_accum_utf8_put(&emit->ea, 'n');
                        done_esc = true;
                        break;
                    case '\r':
                        fy_emit_accum_utf8_put(&emit->ea, 'r');
                        done_esc = true;
                        break;
                    case '\t':
                        fy_emit_accum_utf8_put(&emit->ea, 't');
                        done_esc = true;
                        break;
                    case '"':
                        fy_emit_accum_utf8_put(&emit->ea, '"');
                        done_esc = true;
                        break;
                    case '\\':
                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        done_esc = true;
                        break;
                }

                if (done_esc)
                    goto done;

                if (!fy_emit_is_json_mode(emit)) {
                    switch (c) {
                        case '\0':
                            fy_emit_accum_utf8_put(&emit->ea, '0');
                            break;
                        case '\a':
                            fy_emit_accum_utf8_put(&emit->ea, 'a');
                            break;
                        case '\v':
                            fy_emit_accum_utf8_put(&emit->ea, 'v');
                            break;
                        case '\e':
                            fy_emit_accum_utf8_put(&emit->ea, 'e');
                            break;
                        case 0x85:
                            fy_emit_accum_utf8_put(&emit->ea, 'N');
                            break;
                        case 0xa0:
                            fy_emit_accum_utf8_put(&emit->ea, '_');
                            break;
                        case 0x2028:
                            fy_emit_accum_utf8_put(&emit->ea, 'L');
                            break;
                        case 0x2029:
                            fy_emit_accum_utf8_put(&emit->ea, 'P');
                            break;
                        default:
                            if ((unsigned int) c <= 0xff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'x');
                                w = 2;
                            } else if ((unsigned int) c <= 0xffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'u');
                                w = 4;
                            } else if ((unsigned int) c <= 0xffffffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'U');
                                w = 8;
                            }

                            for (i = w - 1; i >= 0; i--) {
                                digit = ((unsigned int) c >> (i * 4)) & 15;
                                fy_emit_accum_utf8_put(&emit->ea,
                                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                            }
                            break;
                    }

                } else {
                    /* JSON escapes all others in \uXXXX and \uXXXX\uXXXX */
                    w = 4;
                    if ((unsigned int) c <= 0xffff) {
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) c >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    } else {
                        hi_surrogate = 0xd800 | ((((c >> 16) & 0x1f) - 1) << 6) | ((c >> 10) & 0x3f);
                        lo_surrogate = 0xdc00 | (c & 0x3ff);

                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) hi_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }

                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) lo_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    }
                }
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);
            done:
            emit->flags &= ~FYEF_INDENTATION;
            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_end : di_double_quote_end,
                            flags, indent, wtype);
}